

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

ly_set * lyd_find_instance(lyd_node *data,lys_node *schema)

{
  uint uVar1;
  ly_set *set;
  ly_set *set_00;
  uint local_50;
  uint local_4c;
  uint j;
  uint i;
  lyd_node *iter;
  lys_node *siter;
  ly_set *spath;
  ly_set *ret_aux;
  ly_set *ret;
  lys_node *schema_local;
  lyd_node *data_local;
  
  if (((data == (lyd_node *)0x0) || (schema == (lys_node *)0x0)) ||
     ((schema->nodetype & 0xc1bd) == LYS_UNKNOWN)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_find_instance");
  }
  else {
    ret_aux = ly_set_new();
    set = ly_set_new();
    if ((ret_aux == (ly_set *)0x0) || (schema_local = (lys_node *)data, set == (ly_set *)0x0)) {
      ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyd_find_instance");
    }
    else {
      for (; schema_local->iffeature != (lys_iffeature *)0x0;
          schema_local = (lys_node *)schema_local->iffeature) {
      }
      while (iter = (lyd_node *)schema, schema_local->ext[3] != (lys_ext_instance *)0x0) {
        schema_local = (lys_node *)schema_local->ext;
      }
      while (iter != (lyd_node *)0x0) {
        if (*(int *)&iter->ht == 0x2000) {
          iter = (lyd_node *)iter[1].attr;
        }
        else {
          if (((ulong)iter->ht & 0xc1bd) != 0) {
            ly_set_add(set,iter,1);
          }
          iter = iter->child;
        }
      }
      if (set->number != 0) {
        for (_j = schema_local; _j != (lys_node *)0x0; _j = *(lys_node **)&_j->flags) {
          if ((lys_node *)_j->name == (set->set).s[set->number - 1]) {
            ly_set_add(ret_aux,_j,1);
          }
        }
        uVar1 = set->number;
        while( true ) {
          local_4c = uVar1 - 1;
          if ((local_4c == 0) || (ret_aux->number == 0)) {
            ly_set_free(set);
            return ret_aux;
          }
          set_00 = ly_set_new();
          if (set_00 == (ly_set *)0x0) break;
          for (local_50 = 0; local_50 < ret_aux->number; local_50 = local_50 + 1) {
            for (_j = (ret_aux->set).s[local_50]->parent; _j != (lys_node *)0x0;
                _j = *(lys_node **)&_j->flags) {
              if ((lys_node *)_j->name == (set->set).s[uVar1 - 2]) {
                ly_set_add(set_00,_j,1);
              }
            }
          }
          ly_set_free(ret_aux);
          ret_aux = set_00;
          uVar1 = local_4c;
        }
        ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lyd_find_instance");
      }
    }
    ly_set_free(ret_aux);
    ly_set_free(set);
  }
  return (ly_set *)0x0;
}

Assistant:

ly_set *
lyd_find_instance(const struct lyd_node *data, const struct lys_node *schema)
{
    struct ly_set *ret, *ret_aux, *spath;
    const struct lys_node *siter;
    struct lyd_node *iter;
    unsigned int i, j;

    if (!data || !schema ||
            !(schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION))) {
        LOGARG;
        return NULL;
    }

    ret = ly_set_new();
    spath = ly_set_new();
    if (!ret || !spath) {
        LOGMEM(schema->module->ctx);
        goto error;
    }

    /* find data root */
    while (data->parent) {
        /* vertical move (up) */
        data = data->parent;
    }
    while (data->prev->next) {
        /* horizontal move (left) */
        data = data->prev;
    }

    /* build schema path */
    for (siter = schema; siter; ) {
        if (siter->nodetype == LYS_AUGMENT) {
            siter = ((struct lys_node_augment *)siter)->target;
            continue;
        } else if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION)) {
            /* standard data node */
            ly_set_add(spath, (void*)siter, LY_SET_OPT_USEASLIST);

        } /* else skip the rest node types */
        siter = siter->parent;
    }
    if (!spath->number) {
        /* no valid path */
        goto error;
    }

    /* start searching */
    LY_TREE_FOR((struct lyd_node *)data, iter) {
        if (iter->schema == spath->set.s[spath->number - 1]) {
            ly_set_add(ret, iter, LY_SET_OPT_USEASLIST);
        }
    }
    for (i = spath->number - 1; i; i--) {
        if (!ret->number) {
            /* nothing found */
            break;
        }

        ret_aux = ly_set_new();
        if (!ret_aux) {
            LOGMEM(schema->module->ctx);
            goto error;
        }
        for (j = 0; j < ret->number; j++) {
            LY_TREE_FOR(ret->set.d[j]->child, iter) {
                if (iter->schema == spath->set.s[i - 1]) {
                    ly_set_add(ret_aux, iter, LY_SET_OPT_USEASLIST);
                }
            }
        }
        ly_set_free(ret);
        ret = ret_aux;
    }

    ly_set_free(spath);
    return ret;

error:
    ly_set_free(ret);
    ly_set_free(spath);

    return NULL;
}